

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTests::init
          (CopyImageTests *this,EVP_PKEY_CTX *ctx)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  deUint32 format;
  deUint32 format_00;
  Context *pCVar3;
  bool bVar4;
  int extraout_EAX;
  TestNode *pTVar5;
  TestNode *node;
  TestNode *node_00;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  TestCaseGroup *pTVar8;
  char *pcVar9;
  _Rb_tree_node_base *p_Var10;
  _Base_ptr p_Var11;
  _Rb_tree_node_base *p_Var12;
  long *plVar13;
  void *pvVar14;
  _Base_ptr p_Var15;
  long *plVar16;
  pointer puVar17;
  int iVar18;
  long lVar19;
  pointer puVar20;
  iterator iVar21;
  pointer puVar22;
  long lVar23;
  long lVar24;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nonCompressedFormats;
  string viewClassName;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  compressedTextureFormatViewClasses;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  textureFormatViewClasses;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  mixedViewClasses;
  vector<unsigned_int,_std::allocator<unsigned_int>_> compressedFormats;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_148;
  undefined8 local_128;
  long lStack_120;
  long local_118;
  long lStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_f8;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_c8;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  local_98;
  TestNode *local_68;
  CopyImageTests *local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  TestNode *local_40;
  TestNode *local_38;
  
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar3->m_testCtx,"non_compressed",
             "Test copying between textures.");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  pTVar5[1]._vptr_TestNode = (_func_int **)pCVar3;
  node = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,pCVar3->m_testCtx,"compressed",
             "Test copying between compressed textures.");
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  node[1]._vptr_TestNode = (_func_int **)pCVar3;
  node_00 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,pCVar3->m_testCtx,"mixed",
             "Test copying between compressed and non-compressed textures.");
  node_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  node_00[1]._vptr_TestNode = (_func_int **)pCVar3;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128 = (long *)((ulong)local_128._4_4_ << 0x20);
  local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,1);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,3);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,5);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,7);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8814;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8814;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d82;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d82;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d70;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d70;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,1);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8815;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8815;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,1);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d83;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d83;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,1);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d71;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d71;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8230;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8230;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823b;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x823b;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823c;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x823c;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x881a;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x881a;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d88;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d88;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d76;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d76;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,3);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x881b;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x881b;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,3);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d89;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d89;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,3);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d77;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d77;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x822e;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x822e;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8235;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8235;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8236;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8236;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x822f;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x822f;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8239;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8239;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823a;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x823a;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8058;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8058;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d8e;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d8e;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d7c;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d7c;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8c3a;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8c3a;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x906f;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x906f;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8059;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8059;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8f97;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8f97;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8c43;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8c43;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8c3d;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8c3d;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,5);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8051;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8051;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,5);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d8f;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d8f;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,5);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d7d;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d7d;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,5);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8f96;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8f96;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,5);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8c41;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8c41;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x822d;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x822d;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8233;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8233;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8234;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8234;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x822b;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x822b;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8237;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8237;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8238;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8238;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8f95;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8f95;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,7);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8229;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8229;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,7);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8231;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8231;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,7);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8232;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8232;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,7);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8f94;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8f94;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,8);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,9);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,10);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xb);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xc);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xd);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xe);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xf);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x10);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x11);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x12);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x13);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x14);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x15);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x16);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x17);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x18);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x19);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x1a);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  puVar22 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,8);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9270;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9270;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,8);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9271;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9271;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,9);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9272;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9272;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,9);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9273;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9273;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,10);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9274;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9274;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,10);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9275;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9275;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xb);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9276;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9276;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xb);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9277;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9277;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xc);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9278;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9278;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xc);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9279;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9279;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xd);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b0;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b0;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xd);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d0;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d0;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xe);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b1;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b1;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xe);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d1;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d1;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xf);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b2;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b2;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xf);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d2;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d2;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x10);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b3;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b3;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x10);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d3;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d3;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x11);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b4;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b4;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x11);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d4;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d4;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x12);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b5;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b5;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x12);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d5;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d5;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x13);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b6;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b6;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x13);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d6;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d6;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x14);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b7;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b7;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x14);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d7;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d7;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x15);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b8;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b8;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x15);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d8;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d8;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x16);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b9;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b9;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x16);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d9;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d9;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x17);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93ba;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93ba;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x17);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93da;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93da;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x18);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bb;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93bb;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x18);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93db;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93db;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x19);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bc;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93bc;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x19);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93dc;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93dc;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x1a);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bd;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93bd;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x1a);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93dd;
  iVar21._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93dd;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  lStack_110 = 0;
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_148);
  puVar22 = (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  puVar22 = (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start;
  puVar17 = (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage;
  (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  lStack_110 = 0;
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_148);
  puVar22 = (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  puVar22 = (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start;
  puVar17 = (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage;
  (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar22 != (pointer)0x0) {
    operator_delete(puVar22,(long)puVar17 - (long)puVar22);
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8814;
  iVar21._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8814;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d70;
  iVar21._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d70;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d82;
  iVar21._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d82;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9278;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9278;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9279;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9279;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9272;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9272;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9273;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9273;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b0;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b0;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b1;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b1;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b2;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b2;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b3;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b3;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b4;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b4;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b5;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b5;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b6;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b6;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b7;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b7;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b8;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b8;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b9;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93b9;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93ba;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93ba;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bb;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93bb;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bc;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93bc;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bd;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93bd;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d0;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d0;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d1;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d1;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d2;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d2;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d3;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d3;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d4;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d4;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d5;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d5;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d6;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d6;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d7;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d7;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d8;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d8;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d9;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93d9;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93da;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93da;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93db;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93db;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93dc;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93dc;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93dd;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x93dd;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x881a;
  iVar21._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x881a;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d76;
  iVar21._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d76;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d88;
  iVar21._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8d88;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8230;
  iVar21._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x8230;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823c;
  iVar21._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x823c;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823b;
  iVar21._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x823b;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9270;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9270;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9271;
  iVar21._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68 = node;
  local_60 = this;
  local_40 = node_00;
  if (iVar21._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar21,(uint *)&local_148);
  }
  else {
    *iVar21._M_current = 0x9271;
    iVar21._M_current = iVar21._M_current + 1;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar21._M_current;
  }
  p_Var12 = local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_c8._M_t._M_impl.super__Rb_tree_header) {
    do {
      local_38 = pTVar5;
      pTVar5 = local_38;
      _Var1 = p_Var10[1]._M_color;
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar3 = (local_60->super_TestCaseGroup).m_context;
      pcVar9 = viewClassToName(_Var1);
      tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar8,pCVar3->m_testCtx,pcVar9,pcVar9);
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00b2a170;
      pTVar8->m_context = pCVar3;
      iVar21._M_current = (uint *)pTVar8;
      tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar8);
      p_Var11 = p_Var10[1]._M_parent;
      p_Var15 = p_Var10[1]._M_left;
      if (0 < (int)((ulong)((long)p_Var15 - (long)p_Var11) >> 2)) {
        lVar24 = 0;
        do {
          iVar18 = (int)((ulong)((long)p_Var15 - (long)p_Var11) >> 2);
          if (iVar18 < 1) {
            lVar19 = (long)iVar18;
          }
          else {
            lVar23 = 0;
            do {
              _Var1 = (&p_Var11->_M_color)[lVar24];
              _Var2 = (&p_Var11->_M_color)[lVar23];
              if (((_Var1 == _Var2) || (bVar4 = isFloatFormat(_Var1), !bVar4)) ||
                 (bVar4 = isFloatFormat(_Var2), !bVar4)) {
                iVar21._M_current = (uint *)(ulong)_Var1;
                addCopyTests(pTVar8,_Var1,_Var2);
              }
              lVar23 = lVar23 + 1;
              p_Var11 = p_Var10[1]._M_parent;
              p_Var15 = p_Var10[1]._M_left;
              lVar19 = (long)(int)((ulong)((long)p_Var15 - (long)p_Var11) >> 2);
            } while (lVar23 < lVar19);
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 < lVar19);
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      p_Var12 = local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pTVar5 = local_38;
    } while ((_Rb_tree_header *)p_Var10 != &local_c8._M_t._M_impl.super__Rb_tree_header);
  }
  for (; (_Rb_tree_header *)p_Var12 != &local_f8._M_t._M_impl.super__Rb_tree_header;
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    _Var1 = p_Var12[1]._M_color;
    pTVar8 = (TestCaseGroup *)operator_new(0x78);
    pCVar3 = (local_60->super_TestCaseGroup).m_context;
    pcVar9 = viewClassToName(_Var1);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar8,pCVar3->m_testCtx,pcVar9,pcVar9);
    (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_00b2a170;
    pTVar8->m_context = pCVar3;
    iVar21._M_current = (uint *)pTVar8;
    tcu::TestNode::addChild(local_68,(TestNode *)pTVar8);
    p_Var11 = p_Var12[1]._M_parent;
    p_Var15 = p_Var12[1]._M_left;
    if (0 < (int)((ulong)((long)p_Var15 - (long)p_Var11) >> 2)) {
      lVar24 = 0;
      do {
        iVar18 = (int)((ulong)((long)p_Var15 - (long)p_Var11) >> 2);
        if (iVar18 < 1) {
          lVar19 = (long)iVar18;
        }
        else {
          lVar23 = 0;
          do {
            _Var1 = (&p_Var11->_M_color)[lVar24];
            _Var2 = (&p_Var11->_M_color)[lVar23];
            if (((_Var1 == _Var2) || (bVar4 = isFloatFormat(_Var1), !bVar4)) ||
               (bVar4 = isFloatFormat(_Var2), !bVar4)) {
              iVar21._M_current = (uint *)(ulong)_Var1;
              addCopyTests(pTVar8,_Var1,_Var2);
            }
            lVar23 = lVar23 + 1;
            p_Var11 = p_Var12[1]._M_parent;
            p_Var15 = p_Var12[1]._M_left;
            lVar19 = (long)(int)((ulong)((long)p_Var15 - (long)p_Var11) >> 2);
          } while (lVar23 < lVar19);
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 < lVar19);
    }
  }
  if ((_Rb_tree_header *)local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_98._M_t._M_impl.super__Rb_tree_header) {
    pTVar5 = (TestNode *)local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pcVar9 = viewClassToName(*(ViewClass *)&(pTVar5->m_name).field_2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,pcVar9,(allocator<char> *)&local_58);
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_148);
      plVar16 = plVar13 + 2;
      if ((long *)*plVar13 == plVar16) {
        local_118 = *plVar16;
        lStack_110 = plVar13[3];
        local_128 = &local_118;
      }
      else {
        local_118 = *plVar16;
        local_128 = (long *)*plVar13;
      }
      lStack_120 = plVar13[1];
      *plVar13 = (long)plVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if ((pointer *)
          CONCAT44(local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start._4_4_,
                   local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start._0_4_) !=
          &local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete((undefined1 *)
                        CONCAT44(local_148.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_148.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_),
                        (long)local_148.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar3 = (local_60->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,pCVar3->m_testCtx,(char *)local_128,(char *)local_128);
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00b2a170;
      pTVar8->m_context = pCVar3;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_148,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(pTVar5->m_name).field_2 + 8));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_58,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &(pTVar5->m_description).field_2);
      iVar21._M_current = (uint *)pTVar8;
      tcu::TestNode::addChild(local_40,(TestNode *)pTVar8);
      pvVar14 = (void *)CONCAT44(local_148.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_148.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_);
      puVar22 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_68 = pTVar5;
      if (0 < (int)((ulong)((long)local_148.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pvVar14) >> 2))
      {
        lVar24 = 0;
        puVar17 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        puVar20 = local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          if (0 < (int)((ulong)((long)puVar17 - (long)puVar22) >> 2)) {
            lVar19 = 0;
            do {
              format = *(deUint32 *)
                        (CONCAT44(local_148.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_148.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar24 * 4);
              format_00 = puVar22[lVar19];
              if (((format == format_00) || (bVar4 = isFloatFormat(format), !bVar4)) ||
                 (bVar4 = isFloatFormat(format_00), !bVar4)) {
                addCopyTests(pTVar8,format,format_00);
                addCopyTests(pTVar8,format_00,format);
              }
              lVar19 = lVar19 + 1;
              puVar22 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            } while (lVar19 < (int)((ulong)((long)local_58.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_58.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 2));
            pvVar14 = (void *)CONCAT44(local_148.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_148.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_);
            puVar17 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            puVar20 = local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          lVar24 = lVar24 + 1;
          iVar21._M_current = (uint *)(long)(int)((ulong)((long)puVar20 - (long)pvVar14) >> 2);
        } while (lVar24 < (long)iVar21._M_current);
      }
      pTVar5 = local_68;
      if (puVar22 != (pointer)0x0) {
        iVar21._M_current =
             (uint *)((long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar22);
        operator_delete(puVar22,(ulong)iVar21._M_current);
        pvVar14 = (void *)CONCAT44(local_148.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_148.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_4_);
      }
      if (pvVar14 != (void *)0x0) {
        iVar21._M_current =
             (uint *)((long)local_148.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage - (long)pvVar14);
        operator_delete(pvVar14,(ulong)iVar21._M_current);
      }
      if (local_128 != &local_118) {
        iVar21._M_current = (uint *)(local_118 + 1);
        operator_delete(local_128,(ulong)iVar21._M_current);
      }
      pTVar5 = (TestNode *)std::_Rb_tree_increment((_Rb_tree_node_base *)pTVar5);
    } while (pTVar5 != (TestNode *)&local_98._M_t._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::_M_erase((_Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
              *)local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (_Link_type)iVar21._M_current);
  std::
  _Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::_M_erase((_Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (_Link_type)iVar21._M_current);
  std::
  _Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::_M_erase((_Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (_Link_type)iVar21._M_current);
  return extraout_EAX;
}

Assistant:

void CopyImageTests::init (void)
{
	TestCaseGroup* const	nonCompressedGroup	= new TestCaseGroup(m_context, "non_compressed", "Test copying between textures.");
	TestCaseGroup* const	compressedGroup		= new TestCaseGroup(m_context, "compressed", "Test copying between compressed textures.");
	TestCaseGroup* const	mixedGroup			= new TestCaseGroup(m_context, "mixed", "Test copying between compressed and non-compressed textures.");

	addChild(nonCompressedGroup);
	addChild(compressedGroup);
	addChild(mixedGroup);

	map<ViewClass, vector<deUint32> >							textureFormatViewClasses;
	map<ViewClass, vector<deUint32> >							compressedTextureFormatViewClasses;
	map<ViewClass, pair<vector<deUint32>, vector<deUint32> > >	mixedViewClasses;

	// Texture view classes
	textureFormatViewClasses[VIEWCLASS_128_BITS]		= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_96_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_64_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_48_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_32_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_24_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_16_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_8_BITS]			= vector<deUint32>();

	// 128bit / VIEWCLASS_128_BITS
	textureFormatViewClasses[VIEWCLASS_128_BITS].push_back(GL_RGBA32F);
	textureFormatViewClasses[VIEWCLASS_128_BITS].push_back(GL_RGBA32I);
	textureFormatViewClasses[VIEWCLASS_128_BITS].push_back(GL_RGBA32UI);

	// 96bit / VIEWCLASS_96_BITS
	textureFormatViewClasses[VIEWCLASS_96_BITS].push_back(GL_RGB32F);
	textureFormatViewClasses[VIEWCLASS_96_BITS].push_back(GL_RGB32I);
	textureFormatViewClasses[VIEWCLASS_96_BITS].push_back(GL_RGB32UI);

	// 64bit / VIEWCLASS_64_BITS
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RG32F);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RG32I);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RG32UI);

	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RGBA16F);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RGBA16I);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RGBA16UI);

	// 48bit / VIEWCLASS_48_BITS
	textureFormatViewClasses[VIEWCLASS_48_BITS].push_back(GL_RGB16F);
	textureFormatViewClasses[VIEWCLASS_48_BITS].push_back(GL_RGB16I);
	textureFormatViewClasses[VIEWCLASS_48_BITS].push_back(GL_RGB16UI);

	// 32bit / VIEWCLASS_32_BITS
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R32F);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R32I);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R32UI);

	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RG16F);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RG16I);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RG16UI);

	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8I);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8UI);

	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R11F_G11F_B10F);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGB10_A2UI);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGB10_A2);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8_SNORM);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_SRGB8_ALPHA8);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGB9_E5);

	// 24bit / VIEWCLASS_24_BITS
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8I);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8UI);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8_SNORM);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_SRGB8);

	// 16bit / VIEWCLASS_16_BITS
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_R16F);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_R16I);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_R16UI);

	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8I);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8UI);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8_SNORM);

	// 8bit / VIEWCLASS_8_BITS
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8);
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8I);
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8UI);
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8_SNORM);

	// Compressed texture view classes
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_R11]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_RG11]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGB]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGBA]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_EAC_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_4x4_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x4_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x5_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x5_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x6_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x5_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x6_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x8_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x5_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x6_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x8_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x10_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x10_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x12_RGBA]	= vector<deUint32>();

	// VIEWCLASS_EAC_R11
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_R11].push_back(GL_COMPRESSED_R11_EAC);
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_R11].push_back(GL_COMPRESSED_SIGNED_R11_EAC);

	// VIEWCLASS_EAC_RG11
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_RG11].push_back(GL_COMPRESSED_RG11_EAC);
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_RG11].push_back(GL_COMPRESSED_SIGNED_RG11_EAC);

	// VIEWCLASS_ETC2_RGB
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGB].push_back(GL_COMPRESSED_RGB8_ETC2);
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGB].push_back(GL_COMPRESSED_SRGB8_ETC2);

	// VIEWCLASS_ETC2_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGBA].push_back(GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2);
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGBA].push_back(GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2);

	// VIEWCLASS_ETC2_EAC_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_EAC_RGBA].push_back(GL_COMPRESSED_RGBA8_ETC2_EAC);
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_EAC_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC);

	// VIEWCLASS_ASTC_4x4_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_4x4_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_4x4);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_4x4_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4);

	// VIEWCLASS_ASTC_5x4_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x4_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_5x4);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x4_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4);

	// VIEWCLASS_ASTC_5x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_5x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5);

	// VIEWCLASS_ASTC_6x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_6x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5);

	// VIEWCLASS_ASTC_6x6_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x6_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_6x6);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x6_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6);

	// VIEWCLASS_ASTC_8x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_8x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5);

	// VIEWCLASS_ASTC_8x6_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x6_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_8x6);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x6_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6);

	// VIEWCLASS_ASTC_8x8_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x8_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_8x8);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x8_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8);

	// VIEWCLASS_ASTC_10x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5);

	// VIEWCLASS_ASTC_10x6_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x6_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x6);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x6_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6);

	// VIEWCLASS_ASTC_10x8_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x8_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x8);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x8_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8);

	// VIEWCLASS_ASTC_10x10_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x10_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x10);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x10_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10);

	// VIEWCLASS_ASTC_12x10_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x10_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_12x10);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x10_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10);

	// VIEWCLASS_ASTC_12x12_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x12_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_12x12);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x12_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12);

	// Mixed view classes
	mixedViewClasses[VIEWCLASS_128_BITS] = pair<vector<deUint32>, vector<deUint32> >();
	mixedViewClasses[VIEWCLASS_64_BITS] = pair<vector<deUint32>, vector<deUint32> >();

	// 128 bits

	// Non compressed
	mixedViewClasses[VIEWCLASS_128_BITS].first.push_back(GL_RGBA32F);
	mixedViewClasses[VIEWCLASS_128_BITS].first.push_back(GL_RGBA32UI);
	mixedViewClasses[VIEWCLASS_128_BITS].first.push_back(GL_RGBA32I);

	// Compressed
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA8_ETC2_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RG11_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SIGNED_RG11_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_4x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_5x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_5x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_6x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_6x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_8x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_8x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_8x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_12x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_12x12);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12);

	// 64 bits

	// Non compressed
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RGBA16F);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RGBA16UI);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RGBA16I);

	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RG32F);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RG32UI);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RG32I);

	// Compressed
	mixedViewClasses[VIEWCLASS_64_BITS].second.push_back(GL_COMPRESSED_R11_EAC);
	mixedViewClasses[VIEWCLASS_64_BITS].second.push_back(GL_COMPRESSED_SIGNED_R11_EAC);

	for (map<ViewClass, vector<deUint32> >::const_iterator viewClassIter = textureFormatViewClasses.begin(); viewClassIter != textureFormatViewClasses.end(); ++viewClassIter)
	{
		const vector<deUint32>&	formats		= viewClassIter->second;
		const ViewClass			viewClass	= viewClassIter->first;
		TestCaseGroup* const	viewGroup	= new TestCaseGroup(m_context, viewClassToName(viewClass), viewClassToName(viewClass));

		nonCompressedGroup->addChild(viewGroup);

		for (int srcFormatNdx = 0; srcFormatNdx < (int)formats.size(); srcFormatNdx++)
		for (int dstFormatNdx = 0; dstFormatNdx < (int)formats.size(); dstFormatNdx++)
		{
			const deUint32 srcFormat = formats[srcFormatNdx];
			const deUint32 dstFormat = formats[dstFormatNdx];

			if (srcFormat != dstFormat && isFloatFormat(srcFormat) && isFloatFormat(dstFormat))
				continue;

			addCopyTests(viewGroup, srcFormat, dstFormat);
		}
	}

	for (map<ViewClass, vector<deUint32> >::const_iterator viewClassIter = compressedTextureFormatViewClasses.begin(); viewClassIter != compressedTextureFormatViewClasses.end(); ++viewClassIter)
	{
		const vector<deUint32>&	formats		= viewClassIter->second;
		const ViewClass			viewClass	= viewClassIter->first;
		TestCaseGroup* const	viewGroup	= new TestCaseGroup(m_context, viewClassToName(viewClass), viewClassToName(viewClass));

		compressedGroup->addChild(viewGroup);

		for (int srcFormatNdx = 0; srcFormatNdx < (int)formats.size(); srcFormatNdx++)
		for (int dstFormatNdx = 0; dstFormatNdx < (int)formats.size(); dstFormatNdx++)
		{
			const deUint32 srcFormat = formats[srcFormatNdx];
			const deUint32 dstFormat = formats[dstFormatNdx];

			if (srcFormat != dstFormat && isFloatFormat(srcFormat) && isFloatFormat(dstFormat))
				continue;

			addCopyTests(viewGroup, srcFormat, dstFormat);
		}
	}

	for (map<ViewClass, pair<vector<deUint32>, vector<deUint32> > >::const_iterator iter = mixedViewClasses.begin(); iter != mixedViewClasses.end(); ++iter)
	{
		const ViewClass			viewClass				= iter->first;
		const string			viewClassName			= string(viewClassToName(viewClass)) + "_mixed";
		TestCaseGroup* const	viewGroup				= new TestCaseGroup(m_context, viewClassName.c_str(), viewClassName.c_str());

		const vector<deUint32>	nonCompressedFormats	= iter->second.first;
		const vector<deUint32>	compressedFormats		= iter->second.second;

		mixedGroup->addChild(viewGroup);

		for (int srcFormatNdx = 0; srcFormatNdx < (int)nonCompressedFormats.size(); srcFormatNdx++)
		for (int dstFormatNdx = 0; dstFormatNdx < (int)compressedFormats.size(); dstFormatNdx++)
		{
			const deUint32 srcFormat = nonCompressedFormats[srcFormatNdx];
			const deUint32 dstFormat = compressedFormats[dstFormatNdx];

			if (srcFormat != dstFormat && isFloatFormat(srcFormat) && isFloatFormat(dstFormat))
				continue;

			addCopyTests(viewGroup, srcFormat, dstFormat);
			addCopyTests(viewGroup, dstFormat, srcFormat);
		}
	}
}